

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O2

void sx__del_job(sx_job_context *ctx,sx__job *job)

{
  sx_lock_t sVar1;
  
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  sx_pool_del(ctx->job_pool,job);
  ctx->job_lk = 0;
  return;
}

Assistant:

static void sx__del_job(sx_job_context* ctx, sx__job* job)
{
    sx_lock(ctx->job_lk) {
        sx_pool_del(ctx->job_pool, job);
    }
}